

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FileDescriptorProto_003a0e08
  ;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->package_)._M_dataplus._M_p = (pointer)&(this->package_).field_2;
  (this->package_)._M_string_length = 0;
  (this->package_).field_2._M_local_buf[0] = '\0';
  memset(&this->dependency_,0,0x90);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto() = default;